

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

int copy_file(char *src,char *dst)

{
  uint uVar1;
  FILE *__stream;
  FILE *__s;
  size_t __n;
  size_t sVar2;
  uchar buf [4096];
  undefined1 auStack_1028 [4096];
  
  __stream = fopen(src,"rb");
  __s = fopen(dst,"wb");
  uVar1 = 0;
  if (__s != (FILE *)0x0 && __stream != (FILE *)0x0) {
    do {
      __n = fread(auStack_1028,1,0x1000,__stream);
      sVar2 = 0;
      if (__n == 0) break;
      sVar2 = fwrite(auStack_1028,1,__n,__s);
    } while (__n == sVar2);
    fclose(__stream);
    fclose(__s);
    uVar1 = (uint)(sVar2 == 0);
  }
  return uVar1;
}

Assistant:

int copy_file(const char* src, const char* dst)
{
#ifdef _WIN32
    return CopyFile(src, dst, FALSE);
#else
    size_t nread, nwrite;
    unsigned char buf[4096];
    FILE* i = fopen(src, "rb");
    FILE* o = fopen(dst, "wb");

    if (i == NULL || o == NULL)
        return 0;

    do
    {
        nread = fread(buf, 1, 4096, i);
        if (nread)
            nwrite = fwrite(buf, 1, nread, o);
        else
            nwrite = 0;
    } while (nread > 0 && nread == nwrite);

    fclose(i);
    fclose(o);

    if (nwrite)
        return 0;

    return 1;
#endif
}